

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

Gia_Man_t * Gia_ManDupMuxesNoHash(Gia_Man_t *p)

{
  Gia_Obj_t *p_00;
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  void *pvVar9;
  Gia_Obj_t *pGVar10;
  bool bVar11;
  int fCompl;
  int iLit1;
  int iLit0;
  int i;
  Gia_Obj_t *pFanC;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  pNew = p;
  if (p->pMuxes != (uint *)0x0) {
    __assert_fail("p->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                  ,0xe5,"Gia_Man_t *Gia_ManDupMuxesNoHash(Gia_Man_t *)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    pNew->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(pNew);
  iLit1 = 0;
  while( true ) {
    bVar11 = false;
    if (iLit1 < pNew->nObjs) {
      pFan0 = Gia_ManObj(pNew,iLit1);
      bVar11 = pFan0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar11) break;
    iVar2 = Gia_ObjIsAnd(pFan0);
    if ((iVar2 != 0) && (iVar2 = Gia_ObjIsMuxType(pFan0), pGVar1 = pNew, iVar2 != 0)) {
      pGVar10 = Gia_ObjFanin0(pFan0);
      Gia_ObjRefDec(pGVar1,pGVar10);
      pGVar1 = pNew;
      pGVar10 = Gia_ObjFanin1(pFan0);
      Gia_ObjRefDec(pGVar1,pGVar10);
    }
    iLit1 = iLit1 + 1;
  }
  iVar2 = Gia_ManObjNum(pNew);
  pObj = (Gia_Obj_t *)Gia_ManStart(iVar2);
  pcVar8 = Abc_UtilStrsav(pNew->pName);
  *(char **)pObj = pcVar8;
  pcVar8 = Abc_UtilStrsav(pNew->pSpec);
  *(char **)&pObj->Value = pcVar8;
  pvVar9 = calloc((long)*(int *)&pObj[2].field_0x4,4);
  *(void **)&pObj[3].field_0x4 = pvVar9;
  Gia_ManFillValue(pNew);
  pGVar10 = Gia_ManConst0(pNew);
  pGVar10->Value = 0;
  iLit1 = 0;
  while( true ) {
    iVar2 = Vec_IntSize(pNew->vCis);
    bVar11 = false;
    if (iLit1 < iVar2) {
      pFan0 = Gia_ManCi(pNew,iLit1);
      bVar11 = pFan0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar11) break;
    uVar7 = Gia_ManAppendCi((Gia_Man_t *)pObj);
    pFan0->Value = uVar7;
    iLit1 = iLit1 + 1;
  }
  iLit1 = 0;
  while( true ) {
    bVar11 = false;
    if (iLit1 < pNew->nObjs) {
      pFan0 = Gia_ManObj(pNew,iLit1);
      bVar11 = pFan0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar11) break;
    iVar2 = Gia_ObjIsAnd(pFan0);
    if ((iVar2 != 0) && (iVar2 = Gia_ObjRefNumId(pNew,iLit1), iVar2 != 0)) {
      iVar2 = Gia_ObjIsMuxType(pFan0);
      pGVar10 = pObj;
      if (iVar2 == 0) {
        iVar2 = Gia_ObjFanin0Copy(pFan0);
        iVar3 = Gia_ObjFanin1Copy(pFan0);
        uVar7 = Gia_ManAppendAnd((Gia_Man_t *)pGVar10,iVar2,iVar3);
        pFan0->Value = uVar7;
      }
      else {
        iVar2 = Gia_ObjRecognizeExor(pFan0,&pFan1,&pFanC);
        pGVar1 = pNew;
        if (iVar2 == 0) {
          pGVar10 = Gia_ObjRecognizeMux(pFan0,&pFanC,&pFan1);
          pGVar1 = pNew;
          iVar2 = Gia_ObjToLit(pNew,pFan1);
          uVar7 = Gia_ObjLitCopy(pGVar1,iVar2);
          pGVar1 = pNew;
          iVar2 = Gia_ObjToLit(pNew,pFanC);
          uVar4 = Gia_ObjLitCopy(pGVar1,iVar2);
          if (uVar7 == uVar4) {
            pFan0->Value = uVar7;
          }
          else {
            iVar2 = Abc_Lit2Var(uVar7);
            iVar3 = Abc_Lit2Var(uVar4);
            pGVar1 = pNew;
            p_00 = pObj;
            if (iVar2 == iVar3) {
              iVar2 = Gia_ObjToLit(pNew,pGVar10);
              iVar2 = Gia_ObjLitCopy(pGVar1,iVar2);
              uVar4 = Abc_LitIsCompl(uVar7);
              uVar5 = Abc_LitIsCompl(iVar2);
              pGVar10 = pObj;
              iVar3 = Abc_LitRegular(uVar7);
              iVar2 = Abc_LitRegular(iVar2);
              uVar7 = Gia_ManAppendXorReal((Gia_Man_t *)pGVar10,iVar3,iVar2);
              pFan0->Value = uVar4 ^ uVar5 ^ uVar7;
            }
            else {
              iVar2 = Gia_ObjToLit(pNew,pGVar10);
              iVar2 = Gia_ObjLitCopy(pGVar1,iVar2);
              pGVar1 = pNew;
              iVar3 = Gia_ObjToLit(pNew,pFanC);
              iVar3 = Gia_ObjLitCopy(pGVar1,iVar3);
              pGVar1 = pNew;
              iVar6 = Gia_ObjToLit(pNew,pFan1);
              iVar6 = Gia_ObjLitCopy(pGVar1,iVar6);
              uVar7 = Gia_ManAppendMuxReal((Gia_Man_t *)p_00,iVar2,iVar3,iVar6);
              pFan0->Value = uVar7;
            }
          }
        }
        else {
          iVar2 = Gia_ObjToLit(pNew,pFan1);
          iVar2 = Gia_ObjLitCopy(pGVar1,iVar2);
          pGVar1 = pNew;
          iVar3 = Gia_ObjToLit(pNew,pFanC);
          iVar3 = Gia_ObjLitCopy(pGVar1,iVar3);
          uVar7 = Abc_LitIsCompl(iVar2);
          uVar4 = Abc_LitIsCompl(iVar3);
          pGVar10 = pObj;
          iVar2 = Abc_LitRegular(iVar2);
          iVar3 = Abc_LitRegular(iVar3);
          uVar5 = Gia_ManAppendXorReal((Gia_Man_t *)pGVar10,iVar2,iVar3);
          pFan0->Value = uVar7 ^ uVar4 ^ uVar5;
        }
      }
    }
    iLit1 = iLit1 + 1;
  }
  iLit1 = 0;
  while( true ) {
    iVar2 = Vec_IntSize(pNew->vCos);
    bVar11 = false;
    if (iLit1 < iVar2) {
      pFan0 = Gia_ManCo(pNew,iLit1);
      bVar11 = pFan0 != (Gia_Obj_t *)0x0;
    }
    pGVar10 = pObj;
    if (!bVar11) break;
    iVar2 = Gia_ObjFanin0Copy(pFan0);
    uVar7 = Gia_ManAppendCo((Gia_Man_t *)pGVar10,iVar2);
    pFan0->Value = uVar7;
    iLit1 = iLit1 + 1;
  }
  iVar2 = Gia_ManRegNum(pNew);
  Gia_ManSetRegNum((Gia_Man_t *)pGVar10,iVar2);
  iVar2 = Gia_ManHasDangling((Gia_Man_t *)pObj);
  if (iVar2 != 0) {
    __assert_fail("!Gia_ManHasDangling(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                  ,0x11a,"Gia_Man_t *Gia_ManDupMuxesNoHash(Gia_Man_t *)");
  }
  return (Gia_Man_t *)pObj;
}

Assistant:

Gia_Man_t * Gia_ManDupMuxesNoHash( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pFan0, * pFan1, * pFanC;
    int i, iLit0, iLit1, fCompl;
    assert( p->pMuxes == NULL );
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    // discount nodes with one fanout pointed to by MUX type
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        Gia_ObjRefDec(p, Gia_ObjFanin0(pObj));
        Gia_ObjRefDec(p, Gia_ObjFanin1(pObj));
    }
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName  = Abc_UtilStrsav( p->pName );
    pNew->pSpec  = Abc_UtilStrsav( p->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjRefNumId(p, i) )
            continue;
        if ( !Gia_ObjIsMuxType(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjRecognizeExor(pObj, &pFan0, &pFan1) )
        {
            iLit0 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0));
            iLit1 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1));
            fCompl = Abc_LitIsCompl(iLit0) ^ Abc_LitIsCompl(iLit1);
            pObj->Value = fCompl ^ Gia_ManAppendXorReal( pNew, Abc_LitRegular(iLit0), Abc_LitRegular(iLit1) );
        }
        else
        {
            pFanC = Gia_ObjRecognizeMux( pObj, &pFan1, &pFan0 );
            iLit0 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0));
            iLit1 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1));
            if ( iLit0 == iLit1 )
                pObj->Value = iLit0;
            else if ( Abc_Lit2Var(iLit0) == Abc_Lit2Var(iLit1) )
            {
                iLit1 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFanC));
                fCompl = Abc_LitIsCompl(iLit0) ^ Abc_LitIsCompl(iLit1);
                pObj->Value = fCompl ^ Gia_ManAppendXorReal( pNew, Abc_LitRegular(iLit0), Abc_LitRegular(iLit1) );
            }
            else
                pObj->Value = Gia_ManAppendMuxReal( pNew, Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFanC)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0)) );
        }
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    assert( !Gia_ManHasDangling(pNew) );
    return pNew;
}